

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::MemberSorter::operator()
          (MemberSorter *this,uint32_t mbr_idx1,uint32_t mbr_idx2)

{
  Decoration *pDVar1;
  char cVar2;
  
  pDVar1 = (this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
  if (this->sort_aspect == LocationThenBuiltInType) {
    cVar2 = pDVar1[mbr_idx2].builtin;
    if (pDVar1[mbr_idx1].builtin == (bool)cVar2) {
      if (pDVar1[mbr_idx1].builtin != false) {
        return (int)pDVar1[mbr_idx1].builtin_type < (int)pDVar1[mbr_idx2].builtin_type;
      }
      cVar2 = pDVar1[mbr_idx1].location < pDVar1[mbr_idx2].location;
      if (pDVar1[mbr_idx1].location == pDVar1[mbr_idx2].location) {
        cVar2 = pDVar1[mbr_idx1].component < pDVar1[mbr_idx2].component;
      }
    }
  }
  else {
    cVar2 = pDVar1[mbr_idx1].offset < pDVar1[mbr_idx2].offset;
  }
  return (bool)cVar2;
}

Assistant:

bool CompilerMSL::MemberSorter::operator()(uint32_t mbr_idx1, uint32_t mbr_idx2)
{
	auto &mbr_meta1 = meta.members[mbr_idx1];
	auto &mbr_meta2 = meta.members[mbr_idx2];

	if (sort_aspect == LocationThenBuiltInType)
	{
		// Sort first by builtin status (put builtins at end), then by the sorting aspect.
		if (mbr_meta1.builtin != mbr_meta2.builtin)
			return mbr_meta2.builtin;
		else if (mbr_meta1.builtin)
			return mbr_meta1.builtin_type < mbr_meta2.builtin_type;
		else if (mbr_meta1.location == mbr_meta2.location)
			return mbr_meta1.component < mbr_meta2.component;
		else
			return mbr_meta1.location < mbr_meta2.location;
	}
	else
		return mbr_meta1.offset < mbr_meta2.offset;
}